

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationDataBuilder::addCE(CollationDataBuilder *this,int64_t ce,UErrorCode *errorCode)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = (this->ce64s).count;
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      UVector64::addElement(&this->ce64s,ce,errorCode);
      return uVar1;
    }
    if ((this->ce64s).elements[uVar2] == ce) break;
    uVar2 = uVar2 + 1;
  }
  return (int32_t)uVar2;
}

Assistant:

int32_t
CollationDataBuilder::addCE(int64_t ce, UErrorCode &errorCode) {
    int32_t length = ce64s.size();
    for(int32_t i = 0; i < length; ++i) {
        if(ce == ce64s.elementAti(i)) { return i; }
    }
    ce64s.addElement(ce, errorCode);
    return length;
}